

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::UnRegisterProcessForMonitoring
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CSynchData *psdSynchData,
          DWORD dwPid)

{
  LONG *pLVar1;
  MonitoredProcessesListNode *pMVar2;
  PAL_ERROR PVar3;
  MonitoredProcessesListNode *pMVar4;
  MonitoredProcessesListNode *pvMem;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  pMVar4 = (MonitoredProcessesListNode *)0x0;
  pvMem = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
  do {
    pMVar2 = pMVar4;
    pvMem = pvMem->pNext;
    if (pvMem == (MonitoredProcessesListNode *)0x0) {
      PVar3 = 0x490;
      goto LAB_0033c461;
    }
    pMVar4 = pvMem;
  } while (pvMem->psdSynchData != psdSynchData);
  if (pvMem->dwPid != dwPid) {
    fprintf(_stderr,"] %s %s:%d","UnRegisterProcessForMonitoring",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xbce);
    fprintf(_stderr,
            "Expression: dwPid == pmpln->dwPid, Description: Invalid node in Monitored Processes List\n"
           );
  }
  PVar3 = 0;
  pLVar1 = &pvMem->lRefCount;
  *pLVar1 = *pLVar1 + -1;
  if (*pLVar1 == 0) {
    pMVar4 = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
    if (pMVar2 != (MonitoredProcessesListNode *)0x0) {
      pMVar4 = pMVar2;
    }
    pMVar4->pNext = pvMem->pNext;
    this->m_lMonitoredProcessesCount = this->m_lMonitoredProcessesCount + -1;
    CSynchData::Release(pvMem->psdSynchData,pthrCurrent);
    InternalFree(pvMem);
  }
LAB_0033c461:
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  return PVar3;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::UnRegisterProcessForMonitoring(
        CPalThread * pthrCurrent,
        CSynchData *psdSynchData,
        DWORD dwPid)
    {
        PAL_ERROR palErr = NO_ERROR;
        MonitoredProcessesListNode * pmpln, * pmplnPrev = NULL;

        VALIDATEOBJECT(psdSynchData);

        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);

        pmpln = m_pmplnMonitoredProcesses;
        while (pmpln)
        {
            if (psdSynchData == pmpln->psdSynchData)
            {
                _ASSERT_MSG(dwPid == pmpln->dwPid,
                            "Invalid node in Monitored Processes List\n");
                break;
            }

            pmplnPrev = pmpln;
            pmpln = pmpln->pNext;
        }

        if (pmpln)
        {
            if (0 == --pmpln->lRefCount)
            {
                if (NULL != pmplnPrev)
                {
                    pmplnPrev->pNext = pmpln->pNext;
                }
                else
                {
                    m_pmplnMonitoredProcesses = pmpln->pNext;
                }

                m_lMonitoredProcessesCount--;
                pmpln->psdSynchData->Release(pthrCurrent);
                InternalDelete(pmpln);
            }
        }
        else
        {
            palErr = ERROR_NOT_FOUND;
        }

        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        return palErr;
    }